

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O1

string_t duckdb::HugeintCastToVarInt::Operation<duckdb::hugeint_t>
                   (hugeint_t int_value,Vector *result)

{
  byte bVar1;
  int64_t iVar2;
  bool bVar3;
  uint64_t uVar4;
  Vector *in_RCX;
  ulong uVar5;
  long lVar6;
  Vector *len;
  Vector *extraout_RDX;
  Vector *extraout_RDX_00;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uhugeint_t int_value_00;
  string_t blob;
  undefined1 local_60 [16];
  hugeint_t local_50;
  hugeint_t local_40;
  
  len = result;
  local_50 = int_value;
  if (int_value.upper < 0) {
    local_40.lower = 0;
    local_40.upper = -0x8000000000000000;
    bVar3 = hugeint_t::operator==(&local_50,&local_40);
    if (bVar3) {
      int_value_00.upper = (uint64_t)result;
      int_value_00.lower = 0x8000000000000000;
      local_60 = (undefined1  [16])
                 Operation<duckdb::uhugeint_t>((HugeintCastToVarInt *)0x0,int_value_00,in_RCX);
      pcVar8 = local_60._8_8_;
      if ((ulong)local_60._0_4_ < 0xd) {
        pcVar8 = local_60 + 4;
      }
      Varint::SetHeader(pcVar8,(ulong)local_60._0_4_ - 3,true);
      bVar3 = true;
      if (3 < (uint)local_60._0_4_) {
        uVar5 = 3;
        do {
          pcVar8[uVar5] = ~pcVar8[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar5 < (uint)local_60._0_4_);
        bVar3 = (uint)local_60._0_4_ < 0xd;
      }
      uVar5 = (ulong)(uint)local_60._0_4_;
      if (!bVar3) goto LAB_012e80a3;
      pcVar8 = local_60 + 4 + uVar5;
      goto LAB_012e809a;
    }
    local_50 = hugeint_t::operator-(&local_50);
    len = (Vector *)local_50.upper;
  }
  iVar2 = local_50.upper;
  uVar5 = local_50.upper;
  if (local_50.upper == 0xffffffffffffffff) {
LAB_012e7f47:
    auVar13._8_4_ = (int)(uVar5 >> 0x20);
    auVar13._0_8_ = uVar5;
    auVar13._12_4_ = 0x45300000;
    dVar12 = log2((auVar13._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
    dVar12 = ceil(dVar12 * 0.125);
    uVar5 = (ulong)dVar12;
    len = extraout_RDX;
  }
  else {
    uVar5 = 0;
    if (local_50.upper != 0) {
      uVar5 = local_50.upper + 1;
      goto LAB_012e7f47;
    }
  }
  uVar9 = (uint)uVar5;
  if (uVar9 == 0) {
    uVar4 = local_50.lower;
    if (local_50.lower != 0xffffffffffffffff) {
      uVar4 = local_50.lower + 1;
    }
    auVar14._8_4_ = (int)(uVar4 >> 0x20);
    auVar14._0_8_ = uVar4;
    auVar14._12_4_ = 0x45300000;
    dVar12 = log2((auVar14._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
    dVar12 = ceil(dVar12 * 0.125);
    iVar10 = (int)(long)dVar12;
    len = extraout_RDX_00;
  }
  else {
    iVar10 = uVar9 + 8;
  }
  uVar11 = iVar10 + (uint)(iVar10 == 0);
  local_60 = (undefined1  [16])
             StringVector::EmptyString
                       ((StringVector *)result,(Vector *)(ulong)(uVar11 + 3),(idx_t)len);
  pcVar8 = local_60._8_8_;
  if (local_60._0_4_ < 0xd) {
    pcVar8 = local_60 + 4;
  }
  Varint::SetHeader(pcVar8,(ulong)uVar11,(bool)(int_value.upper._7_1_ >> 7));
  bVar1 = (char)int_value.upper._7_1_ >> 7;
  if ((int)uVar9 < 1) {
    uVar5 = 3;
  }
  else {
    lVar6 = (uVar5 & 0xffffffff) * 8;
    uVar5 = 3;
    do {
      lVar6 = lVar6 + -8;
      pcVar8[uVar5] = (byte)((ulong)iVar2 >> ((byte)lVar6 & 0x3f)) ^ bVar1;
      uVar5 = uVar5 + 1;
    } while (uVar9 + 3 != uVar5);
  }
  if (-1 < (int)(~uVar9 + uVar11)) {
    lVar7 = (ulong)(~uVar9 + uVar11) << 3;
    lVar6 = 0;
    do {
      pcVar8[lVar6 + uVar5] = (byte)(local_50.lower >> ((byte)lVar7 & 0x38)) ^ bVar1;
      lVar7 = lVar7 + -8;
      lVar6 = lVar6 + 1;
    } while (uVar11 - uVar9 != (int)lVar6);
  }
  uVar5 = (ulong)(uint)local_60._0_4_;
  if (0xc < uVar5) {
LAB_012e80a3:
    local_60._4_4_ = *(undefined4 *)local_60._8_8_;
    return (string_t)(anon_union_16_2_67f50693_for_value)local_60;
  }
  pcVar8 = local_60 + 4 + uVar5;
LAB_012e809a:
  switchD_0105b559::default(pcVar8,0,0xc - uVar5);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_60;
}

Assistant:

string_t HugeintCastToVarInt::Operation(hugeint_t int_value, Vector &result) {
	// Determine if the number is negative
	bool is_negative = int_value.upper >> 63 & 1;
	if (is_negative) {
		// We must check if it's -170141183460469231731687303715884105728, since it's not possible to negate it
		// without overflowing
		if (int_value == NumericLimits<hugeint_t>::Minimum()) {
			uhugeint_t u_int_value {0x8000000000000000, 0};
			auto cast_value = Operation<uhugeint_t>(u_int_value, result);
			// We have to do all the bit flipping.
			auto writable_value_ptr = cast_value.GetDataWriteable();
			Varint::SetHeader(writable_value_ptr, cast_value.GetSize() - Varint::VARINT_HEADER_SIZE, is_negative);
			for (idx_t i = Varint::VARINT_HEADER_SIZE; i < cast_value.GetSize(); i++) {
				writable_value_ptr[i] = static_cast<char>(~writable_value_ptr[i]);
			}
			cast_value.Finalize();
			return cast_value;
		}
		int_value = -int_value;
	}
	// Determine the number of data bytes
	uint64_t abs_value_upper = static_cast<uint64_t>(int_value.upper);

	uint32_t data_byte_size;
	if (abs_value_upper != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size =
		    (abs_value_upper == 0) ? 0 : static_cast<uint32_t>(std::ceil(std::log2(abs_value_upper + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value_upper) / 8.0));
	}

	uint32_t upper_byte_size = data_byte_size;
	if (data_byte_size > 0) {
		// If we have at least one byte on the upper side, the bottom side is complete
		data_byte_size += 8;
	} else {
		if (int_value.lower != NumericLimits<uint64_t>::Maximum()) {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower + 1) / 8.0));
		} else {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower) / 8.0));
		}
	}

	if (data_byte_size == 0) {
		data_byte_size++;
	}
	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(upper_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value_upper >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value_upper >> i * 8 & 0xFF);
		}
	}
	for (int i = static_cast<int>(data_byte_size - upper_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(int_value.lower >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(int_value.lower >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}